

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

void stbi__out_gif_code(stbi__gif *g,stbi__uint16 code)

{
  stbi__uint16 code_00;
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined6 in_register_00000032;
  
  uVar6 = CONCAT62(in_register_00000032,code) & 0xffffffff;
  code_00 = g->codes[uVar6].prefix;
  if (-1 < (short)code_00) {
    stbi__out_gif_code(g,code_00);
  }
  if (g->cur_y < g->max_y) {
    uVar5 = (long)g->cur_x + (long)g->cur_y;
    psVar2 = g->out;
    g->history[(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 4)] =
         '\x01';
    psVar3 = g->color_table;
    uVar6 = (ulong)g->codes[uVar6].suffix;
    if (0x80 < psVar3[uVar6 * 4 + 3]) {
      psVar2[uVar5] = psVar3[uVar6 * 4 + 2];
      psVar2[uVar5 + 1] = psVar3[uVar6 * 4 + 1];
      psVar2[uVar5 + 2] = psVar3[uVar6 * 4];
      psVar2[uVar5 + 3] = psVar3[uVar6 * 4 + 3];
    }
    iVar4 = g->cur_x + 4;
    g->cur_x = iVar4;
    if (g->max_x <= iVar4) {
      g->cur_x = g->start_x;
      iVar4 = g->cur_y + g->step;
      g->cur_y = iVar4;
      while ((g->max_y <= iVar4 && (iVar1 = g->parse, 0 < iVar1))) {
        iVar4 = g->line_size << ((byte)iVar1 & 0x1f);
        g->step = iVar4;
        iVar4 = (iVar4 >> 1) + g->start_y;
        g->cur_y = iVar4;
        g->parse = iVar1 + -1;
      }
    }
  }
  return;
}

Assistant:

static void stbi__out_gif_code(stbi__gif *g, stbi__uint16 code)
{
   stbi_uc *p, *c;
   int idx;

   // recurse to decode the prefixes, since the linked-list is backwards,
   // and working backwards through an interleaved image would be nasty
   if (g->codes[code].prefix >= 0)
      stbi__out_gif_code(g, g->codes[code].prefix);

   if (g->cur_y >= g->max_y) return;

   idx = g->cur_x + g->cur_y;
   p = &g->out[idx];
   g->history[idx / 4] = 1;

   c = &g->color_table[g->codes[code].suffix * 4];
   if (c[3] > 128) { // don't render transparent pixels;
      p[0] = c[2];
      p[1] = c[1];
      p[2] = c[0];
      p[3] = c[3];
   }
   g->cur_x += 4;

   if (g->cur_x >= g->max_x) {
      g->cur_x = g->start_x;
      g->cur_y += g->step;

      while (g->cur_y >= g->max_y && g->parse > 0) {
         g->step = (1 << g->parse) * g->line_size;
         g->cur_y = g->start_y + (g->step >> 1);
         --g->parse;
      }
   }
}